

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O2

Offset<flatbuffers::Vector<unsigned_char>_> __thiscall
flatbuffers::FlatBufferBuilder::CreateVector<unsigned_char>
          (FlatBufferBuilder *this,uchar *v,size_t len)

{
  uoffset_t uVar1;
  size_t sVar2;
  
  NotNested(this);
  StartVector(this,len,1);
  sVar2 = len;
  while (sVar2 != 0) {
    PushElement<unsigned_char>(this,v[sVar2 - 1]);
    sVar2 = sVar2 - 1;
  }
  uVar1 = PushElement<unsigned_int>(this,(uint)len);
  return (Offset<flatbuffers::Vector<unsigned_char>_>)uVar1;
}

Assistant:

Offset<Vector<T>> CreateVector(const T *v, size_t len) {
    NotNested();
    StartVector(len, sizeof(T));
    for (auto i = len; i > 0; ) {
      PushElement(v[--i]);
    }
    return Offset<Vector<T>>(EndVector(len));
  }